

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall
VulkanHppGenerator::checkStructMemberCorrectness
          (VulkanHppGenerator *this,string *structureName,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *members,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *sTypeValues)

{
  string *this_00;
  string *__rhs;
  _Base_ptr p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  _Base_ptr p_Var12;
  int __c;
  VulkanHppGenerator *pVVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  _Base_ptr name;
  pointer pMVar14;
  size_type sVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arraySize;
  pointer name_00;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string *local_198;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
  *local_190;
  pointer local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  _Base_ptr local_120;
  VulkanHppGenerator *local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  undefined1 local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_80;
  _Base_ptr local_78;
  VulkanHppGenerator *local_70;
  _Base_ptr local_68;
  pointer local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
  *local_58;
  _Base_ptr local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_198 = structureName;
  local_80 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)sTypeValues;
  bVar5 = isTypeUsed(this,structureName);
  pMVar14 = (members->
            super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (members->
             super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_190 = &this->m_types;
  local_110 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118 = (VulkanHppGenerator *)&this->m_enums;
  local_120 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_70 = (VulkanHppGenerator *)&this->m_structs;
  local_78 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58 = &this->m_constants;
  local_68 = (_Base_ptr)members;
  do {
    if (pMVar14 == local_60) {
      return;
    }
    this_00 = &(pMVar14->type).type;
    pVVar13 = (VulkanHppGenerator *)this_00;
    bVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(this_00,"Vk");
    if (bVar6) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
              ::find(&local_190->_M_t,this_00);
      if (cVar8._M_node == local_110) {
        __assert_fail("memberTypeIt != m_types.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4ea,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      p_Var12 = cVar8._M_node[3]._M_left;
      iVar7 = pMVar14->xmlLine;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "struct member type <",this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_160 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "> used in struct <");
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_160 + 0x20),local_198);
      std::operator+(&local_180,&local_1b8,"> is never required for any feature or extension");
      checkForError(p_Var12 != (_Base_ptr)0x0,iVar7,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)(local_160 + 0x20));
      pVVar13 = (VulkanHppGenerator *)local_160;
      std::__cxx11::string::~string((string *)pVVar13);
    }
    p_Var12 = local_68;
    local_188 = pMVar14;
    if ((pMVar14->selector)._M_string_length != 0) {
      cVar9 = findStructMemberIt(pVVar13,&pMVar14->selector,
                                 (vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                                  *)local_68);
      if (cVar9._M_current == (MemberData *)p_Var12->_M_parent) {
        __assert_fail("selectorIt != members.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4f5,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      local_48 = &((cVar9._M_current)->type).type;
      local_108 = (_Base_ptr)
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                          *)local_118,local_48);
      if (local_108 == local_120) {
        __assert_fail("selectorEnumIt != m_enums.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4f7,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      pVVar13 = local_70;
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                       *)local_70,this_00);
      if ((cVar10._M_node == local_78) || (*(char *)((long)&cVar10._M_node[3]._M_left + 2) == '\0'))
      {
        __assert_fail("( unionIt != m_structs.end() ) && unionIt->second.isUnion",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x4f9,
                      "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                     );
      }
      local_50 = *(_Base_ptr *)(cVar10._M_node + 4);
      local_108 = (_Base_ptr)&local_108[5]._M_left;
      p_Var12 = cVar10._M_node[3]._M_right;
      while (p_Var12 != local_50) {
        name = p_Var12[9]._M_right;
        p_Var1 = *(_Base_ptr *)(p_Var12 + 10);
        if (name == p_Var1) {
          __assert_fail("!unionMember.selection.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x4fd,
                        "void VulkanHppGenerator::checkStructMemberCorrectness(const std::string &, const std::vector<MemberData> &, std::set<std::string> &) const"
                       );
        }
        local_38 = p_Var12 + 4;
        local_40 = p_Var12;
        for (; p_Var12 = local_40, name != p_Var1; name = name + 1) {
          bVar6 = contains(pVVar13,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                                    *)local_108,(string *)name);
          iVar7 = *(int *)&p_Var12[0xc]._M_left;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,"union member <",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_100 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,"> uses selection <");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_100 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_160 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,"> that is not part of the selector type <");
          std::operator+(&local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_160 + 0x20),local_48);
          std::operator+(&local_180,&local_1b8,">");
          checkForError(bVar6,iVar7,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::__cxx11::string::~string((string *)(local_160 + 0x20));
          std::__cxx11::string::~string((string *)local_160);
          std::__cxx11::string::~string((string *)(local_100 + 0x20));
          pVVar13 = (VulkanHppGenerator *)local_100;
          std::__cxx11::string::~string((string *)pVVar13);
        }
        pMVar14 = local_188;
        p_Var12 = (_Base_ptr)&local_40[0xc]._M_right;
      }
    }
    bVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
            ::contains(local_190,this_00);
    iVar7 = pMVar14->xmlLine;
    std::operator+(&local_1b8,"struct member uses unknown type <",this_00);
    std::operator+(&local_180,&local_1b8,">");
    checkForError(bVar6,iVar7,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1b8);
    pbVar2 = (pMVar14->arraySizes).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (name_00 = (pMVar14->arraySizes).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; name_00 != pbVar2;
        name_00 = name_00 + 1) {
      bVar6 = isNumber(name_00);
      if ((!bVar6) &&
         (bVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                  ::contains(local_58,name_00), !bVar6)) {
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                ::find(&local_190->_M_t,name_00);
        if (cVar8._M_node == local_110) {
          bVar6 = false;
        }
        else {
          pcVar3 = (name_00->_M_dataplus)._M_p;
          sVar4 = name_00->_M_string_length;
          sVar15 = 0;
          do {
            if (sVar4 == sVar15) {
              bVar6 = cVar8._M_node[2]._M_color == 5;
              pMVar14 = local_188;
              goto LAB_00122d7e;
            }
            __c = (int)pcVar3[sVar15];
            iVar7 = toupper(__c);
            sVar15 = sVar15 + 1;
          } while (iVar7 == __c);
          bVar6 = false;
          pMVar14 = local_188;
        }
LAB_00122d7e:
        iVar7 = pMVar14->xmlLine;
        std::operator+(&local_1b8,"struct member array size uses unknown constant <",name_00);
        std::operator+(&local_180,&local_1b8,">");
        checkForError(bVar6,iVar7,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
    }
    if ((pMVar14->value)._M_string_length != 0) {
      __rhs = &pMVar14->value;
      pVVar13 = local_118;
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                       *)local_118,this_00);
      if (cVar11._M_node == local_120) {
        bVar6 = std::operator==(this_00,"uint32_t");
        if (bVar6) {
          bVar6 = isNumber(__rhs);
          iVar7 = pMVar14->xmlLine;
          std::operator+(&local_c0,"value <",__rhs);
          std::operator+(&local_a0,&local_c0,"> for member <");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,&local_a0,&pMVar14->name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_100 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,"> in structure <");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_100 + 0x20),local_198);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_160 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,"> of type <");
          std::operator+(&local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_160 + 0x20),this_00);
          std::operator+(&local_180,&local_1b8,"> is not a number");
          checkForError(bVar6,iVar7,&local_180);
        }
        else {
          iVar7 = pMVar14->xmlLine;
          std::operator+(&local_c0,"member <",&pMVar14->name);
          std::operator+(&local_a0,&local_c0,"> in structure <");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,&local_a0,local_198);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_100 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,"> holds value <");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_100 + 0x20),__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_160 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,"> for an unhandled type <");
          std::operator+(&local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_160 + 0x20),this_00);
          std::operator+(&local_180,&local_1b8,">");
          checkForError(false,iVar7,&local_180);
        }
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)(local_160 + 0x20));
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)(local_100 + 0x20));
        std::__cxx11::string::~string((string *)local_100);
        std::__cxx11::string::~string((string *)&local_a0);
        this_01 = &local_c0;
LAB_0012322c:
        std::__cxx11::string::~string((string *)this_01);
      }
      else if (bVar5) {
        bVar6 = contains(pVVar13,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                                  *)&cVar11._M_node[5]._M_left,__rhs);
        iVar7 = pMVar14->xmlLine;
        std::operator+(&local_c0,"value <",__rhs);
        std::operator+(&local_a0,&local_c0,"> for member <");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,&local_a0,&pMVar14->name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_100 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,"> in structure <");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_100 + 0x20),local_198);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_160 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_160,"> of enum type <");
        std::operator+(&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_160 + 0x20),this_00);
        std::operator+(&local_180,&local_1b8,"> not listed");
        checkForError(bVar6,iVar7,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)(local_160 + 0x20));
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)(local_100 + 0x20));
        std::__cxx11::string::~string((string *)local_100);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        bVar6 = std::operator==(&pMVar14->name,"sType");
        if (bVar6) {
          pVar16 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>(local_80,__rhs);
          iVar7 = pMVar14->xmlLine;
          std::operator+(&local_1b8,"sType value <",__rhs);
          std::operator+(&local_180,&local_1b8,"> has been used before");
          checkForError((bool)(pVar16.second & 1),iVar7,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          this_01 = &local_1b8;
          goto LAB_0012322c;
        }
      }
    }
    pMVar14 = pMVar14 + 1;
  } while( true );
}

Assistant:

void VulkanHppGenerator::checkStructMemberCorrectness( std::string const &             structureName,
                                                       std::vector<MemberData> const & members,
                                                       std::set<std::string> &         sTypeValues ) const
{
  // determine if this struct is requird/used
  const bool structUsed = isTypeUsed( structureName );

  for ( auto const & member : members )
  {
    // check that all member types are required in some feature or extension
    if ( member.type.type.starts_with( "Vk" ) )
    {
      auto memberTypeIt = m_types.find( member.type.type );
      assert( memberTypeIt != m_types.end() );
      checkForError( !memberTypeIt->second.requiredBy.empty(),
                     member.xmlLine,
                     "struct member type <" + member.type.type + "> used in struct <" + structureName + "> is never required for any feature or extension" );
    }

    // if a member specifies a selector, that member is a union and the selector is an enum
    // check that there's a 1-1 connection between the specified selections and the values of that enum
    if ( !member.selector.empty() )
    {
      auto selectorIt = findStructMemberIt( member.selector, members );
      assert( selectorIt != members.end() );
      auto selectorEnumIt = m_enums.find( selectorIt->type.type );
      assert( selectorEnumIt != m_enums.end() );
      auto unionIt = m_structs.find( member.type.type );
      assert( ( unionIt != m_structs.end() ) && unionIt->second.isUnion );
      for ( auto const & unionMember : unionIt->second.members )
      {
        // check that each union member has a selection, that is a value of the seleting enum
        assert( !unionMember.selection.empty() );
        for ( auto const & selection : unionMember.selection )
        {
          checkForError( contains( selectorEnumIt->second.values, selection ),
                         unionMember.xmlLine,
                         "union member <" + unionMember.name + "> uses selection <" + selection + "> that is not part of the selector type <" +
                           selectorIt->type.type + ">" );
        }
      }
    }

    // check that each member type is known
    checkForError( m_types.contains( member.type.type ), member.xmlLine, "struct member uses unknown type <" + member.type.type + ">" );

    // check that any used constant is a known constant or some potentially externally defined constant
    for ( auto const & arraySize : member.arraySizes )
    {
      if ( !isNumber( arraySize ) && !m_constants.contains( arraySize ) )
      {
        auto typeIt = m_types.find( arraySize );
        checkForError( ( typeIt != m_types.end() ) && isAllUpper( arraySize ) && ( typeIt->second.category == TypeCategory::ExternalType ),
                       member.xmlLine,
                       "struct member array size uses unknown constant <" + arraySize + ">" );
      }
    }

    // checks if a value is specified
    if ( !member.value.empty() )
    {
      auto enumIt = m_enums.find( member.type.type );
      if ( enumIt != m_enums.end() )
      {
        // check that the value exists in the specified enum (if the struct is used at all)
        if ( structUsed )
        {
          checkForError( contains( enumIt->second.values, member.value ),
                         member.xmlLine,
                         "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of enum type <" +
                           member.type.type + "> not listed" );
          // special handling for sType: no value should appear more than once
          if ( member.name == "sType" )
          {
            checkForError( sTypeValues.insert( member.value ).second, member.xmlLine, "sType value <" + member.value + "> has been used before" );
          }
        }
      }
      else if ( member.type.type == "uint32_t" )
      {
        checkForError( isNumber( member.value ),
                       member.xmlLine,
                       "value <" + member.value + "> for member <" + member.name + "> in structure <" + structureName + "> of type <" + member.type.type +
                         "> is not a number" );
      }
      else
      {
        // don't know the type of the value -> error out
        checkForError( false,
                       member.xmlLine,
                       "member <" + member.name + "> in structure <" + structureName + "> holds value <" + member.value + "> for an unhandled type <" +
                         member.type.type + ">" );
      }
    }
  }
}